

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::CommandRunner::CheckAssertReturnResult
          (CommandRunner *this,AssertReturnCommand *command,int index,ExpectedValue expected,
          TypedValue actual,bool print_error)

{
  uint32_t uVar1;
  ExpectedValue expected_00;
  TypedValue actual_00;
  _Alloc_hider _Var2;
  u32 uVar3;
  u32 uVar4;
  uint uVar5;
  Result RVar6;
  Ref RVar7;
  Ref RVar8;
  u64 uVar9;
  u64 uVar10;
  undefined4 in_register_00000014;
  uint *ev;
  ExpectedValue *extraout_RDX;
  ExpectedValue *extraout_RDX_00;
  TypedValue *tv;
  ExpectedValue *extraout_RDX_01;
  ExpectedValue *extraout_RDX_02;
  ExpectedValue *extraout_RDX_03;
  ExpectedValue *extraout_RDX_04;
  ExpectedValue *ev_00;
  TypedValue *tv_00;
  ExpectedValue *extraout_RDX_05;
  ExpectedValue *extraout_RDX_06;
  ExpectedValue *extraout_RDX_07;
  ExpectedValue *extraout_RDX_08;
  uint lane;
  bool bVar11;
  f32 fVar12;
  f32 fVar13;
  u64 bits;
  f64 fVar14;
  TypedValue lane_actual;
  ExpectedValue lane_expected;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  ExpectedValue local_a8;
  string local_70;
  string local_50;
  
  ev = (uint *)CONCAT44(in_register_00000014,index);
  if (expected.value.type.enum_ == actual.type.enum_) {
    ev = &switchD_0018a135::switchdataD_001e90d0;
    switch(expected.value.type.enum_) {
    case ExternRef:
      goto switchD_0018a135_caseD_ffffffef;
    case FuncRef:
switchD_0018a135_caseD_fffffff0:
      bVar11 = actual.type.enum_ == FuncRef;
      break;
    default:
switchD_0018a135_caseD_fffffff1:
      abort();
    case I16:
    case I8:
    case I32:
      uVar3 = wabt::interp::Value::Get<unsigned_int>(&expected.value.value);
      uVar4 = wabt::interp::Value::Get<unsigned_int>(&actual.value);
      bVar11 = uVar3 == uVar4;
      ev = (uint *)extraout_RDX;
      break;
    case V128:
      bVar11 = true;
      lane = 0;
      while( true ) {
        uVar5 = LaneCountFromType(expected.lane_type);
        ev = (uint *)extraout_RDX_04;
        if (uVar5 <= lane) break;
        GetLane(&local_a8,&expected,lane);
        GetLane((TypedValue *)local_c8,&actual,expected.lane_type,lane);
        expected_00.value.value.field_0.i64_ = local_a8.value.value.field_0.i64_;
        expected_00.value.type.enum_ = local_a8.value.type.enum_;
        expected_00.value._4_4_ = local_a8.value._4_4_;
        expected_00.value.value.field_0._8_8_ = local_a8.value.value.field_0._8_8_;
        expected_00.value.value.type.enum_ = local_a8.value.value.type.enum_;
        expected_00.value.value._20_4_ = local_a8.value.value._20_4_;
        expected_00.lane_type.enum_ = local_a8.lane_type.enum_;
        expected_00.nan[0] = local_a8.nan[0];
        expected_00.nan[1] = local_a8.nan[1];
        expected_00.nan[2] = local_a8.nan[2];
        expected_00.nan[3] = local_a8.nan[3];
        expected_00._52_4_ = local_a8._52_4_;
        actual_00.value.field_0.i64_ = local_c8._8_8_;
        actual_00._0_8_ = local_c8._0_8_;
        actual_00.value.field_0._8_8_ = local_b8._M_allocated_capacity;
        actual_00.value._16_8_ = local_b8._8_8_;
        RVar6 = CheckAssertReturnResult(this,command,index,expected_00,actual_00,false);
        if (RVar6.enum_ == Error) {
          uVar1 = (command->super_CommandMixin<(wabt::CommandType)7>).super_Command.line;
          ExpectedValueToString_abi_cxx11_(&local_50,(spectest *)&local_a8,ev_00);
          _Var2._M_p = local_50._M_dataplus._M_p;
          wabt::interp::TypedValueToString_abi_cxx11_(&local_70,(interp *)local_c8,tv_00);
          bVar11 = false;
          PrintError(this,uVar1,
                     "mismatch in lane %u of result %u of assert_return: expected %s, got %s",
                     (ulong)lane,(ulong)(uint)index,_Var2._M_p,local_70._M_dataplus._M_p);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
        }
        lane = lane + 1;
      }
      break;
    case F64:
      if (expected.nan[0] != None) {
        if (expected.nan[0] == Canonical) {
          fVar14 = wabt::interp::Value::Get<double>(&actual.value);
          bVar11 = ABS((double)fVar14) == NAN;
          ev = (uint *)extraout_RDX_05;
        }
        else {
          bVar11 = true;
          if (expected.nan[0] != Arithmetic) goto LAB_0018a200;
          fVar14 = wabt::interp::Value::Get<double>(&actual.value);
          bVar11 = (~(ulong)fVar14 & 0x7ff8000000000000) == 0;
          ev = (uint *)extraout_RDX_01;
        }
        break;
      }
      RVar7.index = (size_t)wabt::interp::Value::Get<double>(&expected.value.value);
      RVar8.index = (size_t)wabt::interp::Value::Get<double>(&actual.value);
      ev = (uint *)extraout_RDX_06;
      goto LAB_0018a187;
    case F32:
      if (expected.nan[0] == None) {
        fVar12 = wabt::interp::Value::Get<float>(&expected.value.value);
        fVar13 = wabt::interp::Value::Get<float>(&actual.value);
        bVar11 = fVar12 == fVar13;
        ev = (uint *)extraout_RDX_08;
      }
      else if (expected.nan[0] == Canonical) {
        fVar12 = wabt::interp::Value::Get<float>(&actual.value);
        bVar11 = ABS((float)fVar12) == NAN;
        ev = (uint *)extraout_RDX_07;
      }
      else {
        bVar11 = true;
        if (expected.nan[0] != Arithmetic) goto LAB_0018a200;
        fVar12 = wabt::interp::Value::Get<float>(&actual.value);
        bVar11 = (~(uint)fVar12 & 0x7fc00000) == 0;
        ev = (uint *)extraout_RDX_03;
      }
      break;
    case I64:
      uVar9 = wabt::interp::Value::Get<unsigned_long>(&expected.value.value);
      uVar10 = wabt::interp::Value::Get<unsigned_long>(&actual.value);
      bVar11 = uVar9 == uVar10;
      ev = (uint *)extraout_RDX_02;
    }
  }
  else {
    if (expected.value.type.enum_ != ExternRef) {
      if (expected.value.type.enum_ != FuncRef) {
        if (expected.value.type.enum_ != ExnRef) {
          __assert_fail("expected.value.type == actual.type || IsReference(expected.value.type)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/spectest-interp.cc"
                        ,0x67e,
                        "wabt::Result spectest::CommandRunner::CheckAssertReturnResult(const AssertReturnCommand *, int, ExpectedValue, TypedValue, bool)"
                       );
        }
        goto switchD_0018a135_caseD_fffffff1;
      }
      goto switchD_0018a135_caseD_fffffff0;
    }
switchD_0018a135_caseD_ffffffef:
    RVar7 = wabt::interp::Value::Get<wabt::interp::Ref>(&expected.value.value);
    RVar8 = wabt::interp::Value::Get<wabt::interp::Ref>(&actual.value);
    ev = (uint *)extraout_RDX_00;
LAB_0018a187:
    bVar11 = RVar7.index == RVar8.index;
  }
  if ((~print_error & 1U) == 0 && !bVar11) {
    uVar1 = (command->super_CommandMixin<(wabt::CommandType)7>).super_Command.line;
    ExpectedValueToString_abi_cxx11_((string *)&local_a8,(spectest *)&expected,(ExpectedValue *)ev);
    wabt::interp::TypedValueToString_abi_cxx11_((string *)local_c8,(interp *)&actual,tv);
    bVar11 = false;
    PrintError(this,uVar1,"mismatch in result %u of assert_return: expected %s, got %s",
               (ulong)(uint)index,local_a8.value._0_8_,local_c8._0_8_);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
LAB_0018a200:
  return (Result)(uint)(byte)~bVar11;
}

Assistant:

wabt::Result CommandRunner::CheckAssertReturnResult(
    const AssertReturnCommand* command,
    int index,
    ExpectedValue expected,
    TypedValue actual,
    bool print_error) {
  assert(expected.value.type == actual.type ||
         IsReference(expected.value.type));
  bool ok = true;
  switch (expected.value.type) {
    case Type::I8:
    case Type::I16:
    case Type::I32:
      ok = expected.value.value.Get<u32>() == actual.value.Get<u32>();
      break;

    case Type::I64:
      ok = expected.value.value.Get<u64>() == actual.value.Get<u64>();
      break;

    case Type::F32:
      switch (expected.nan[0]) {
        case ExpectedNan::Arithmetic:
          ok = IsArithmeticNan(actual.value.Get<f32>());
          break;

        case ExpectedNan::Canonical:
          ok = IsCanonicalNan(actual.value.Get<f32>());
          break;

        case ExpectedNan::None:
          ok = Bitcast<u32>(expected.value.value.Get<f32>()) ==
               Bitcast<u32>(actual.value.Get<f32>());
          break;
      }
      break;

    case Type::F64:
      switch (expected.nan[0]) {
        case ExpectedNan::Arithmetic:
          ok = IsArithmeticNan(actual.value.Get<f64>());
          break;

        case ExpectedNan::Canonical:
          ok = IsCanonicalNan(actual.value.Get<f64>());
          break;

        case ExpectedNan::None:
          ok = Bitcast<u64>(expected.value.value.Get<f64>()) ==
               Bitcast<u64>(actual.value.Get<f64>());
          break;
      }
      break;

    case Type::V128: {
      // Compare each lane as if it were its own value.
      for (int lane = 0; lane < LaneCountFromType(expected.lane_type); ++lane) {
        ExpectedValue lane_expected = GetLane(expected, lane);
        TypedValue lane_actual = GetLane(actual, expected.lane_type, lane);

        if (Failed(CheckAssertReturnResult(command, index, lane_expected,
                                           lane_actual, false))) {
          PrintError(command->line,
                     "mismatch in lane %u of result %u of assert_return: "
                     "expected %s, got %s",
                     lane, index, ExpectedValueToString(lane_expected).c_str(),
                     TypedValueToString(lane_actual).c_str());
          ok = false;
        }
      }
      break;
    }

    case Type::FuncRef:
      // A funcref expectation only requires that the reference be a function,
      // but it doesn't check the actual index.
      ok = (actual.type == Type::FuncRef);
      break;

    case Type::ExternRef:
      ok = expected.value.value.Get<Ref>() == actual.value.Get<Ref>();
      break;

    default:
      WABT_UNREACHABLE;
  }

  if (!ok && print_error) {
    PrintError(command->line,
               "mismatch in result %u of assert_return: expected %s, got %s",
               index, ExpectedValueToString(expected).c_str(),
               TypedValueToString(actual).c_str());
  }
  return ok ? wabt::Result::Ok : wabt::Result::Error;
}